

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O1

AutoFile * __thiscall
AutoFile::operator>>
          (AutoFile *this,
          Wrapper<VectorFormatter<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>_>,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_&>
          *obj)

{
  pointer *ppvVar1;
  long lVar2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  iterator __position;
  uint64_t uVar3;
  vector<double,_std::allocator<double>_> *extraout_RDX;
  vector<double,_std::allocator<double>_> *v;
  vector<double,_std::allocator<double>_> *extraout_RDX_00;
  vector<double,_std::allocator<double>_> *extraout_RDX_01;
  ulong uVar4;
  uint64_t __n;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = obj->m_object;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::_M_erase_at_end(this_00,(this_00->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
  uVar3 = ReadCompactSize<AutoFile>(this,true);
  if (uVar3 != 0) {
    __n = 0;
    do {
      uVar4 = __n + 0x32dcd;
      __n = uVar3;
      if (uVar4 < uVar3) {
        __n = uVar4;
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::reserve(this_00,__n);
      v = extraout_RDX;
      while (__position._M_current =
                  (this_00->
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish,
            (ulong)(((long)__position._M_current -
                     (long)(this_00->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <
            __n) {
        if (__position._M_current ==
            (this_00->
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::_M_realloc_insert<>(this_00,__position);
          v = extraout_RDX_00;
        }
        else {
          ((__position._M_current)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((__position._M_current)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((__position._M_current)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ppvVar1 = &(this_00->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppvVar1 = *ppvVar1 + 1;
        }
        VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>::
        Unser<AutoFile,std::vector<double,std::allocator<double>>>
                  ((VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter> *)this,
                   (AutoFile *)
                   ((this_00->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish + -1),v);
        v = extraout_RDX_01;
      }
    } while (uVar4 < uVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

AutoFile& operator>>(T&& obj)
    {
        ::Unserialize(*this, obj);
        return *this;
    }